

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::integrateHierarchicalFunctions
          (TasmanianSparseGrid *this,double *integrals)

{
  bool bVar1;
  int iVar2;
  TypeOneDRule rule;
  runtime_error *this_00;
  pointer pBVar3;
  size_type sVar4;
  double dVar5;
  int local_34;
  int i;
  double scale;
  double *integrals_local;
  TasmanianSparseGrid *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_00,"ERROR: cannot compute the integrals for a basis in an empty grid.");
    __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  pBVar3 = ::std::
           unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
           ::operator->(&this->base);
  (*pBVar3->_vptr_BaseCanonicalGrid[0x23])(pBVar3,integrals);
  sVar4 = ::std::vector<double,_std::allocator<double>_>::size(&this->domain_transform_a);
  if (sVar4 != 0) {
    pBVar3 = ::std::
             unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ::operator->(&this->base);
    iVar2 = BaseCanonicalGrid::getNumDimensions(pBVar3);
    pBVar3 = ::std::
             unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
             ::operator->(&this->base);
    rule = (*pBVar3->_vptr_BaseCanonicalGrid[7])();
    dVar5 = getQuadratureScale(this,iVar2,rule);
    for (local_34 = 0; iVar2 = getNumPoints(this), local_34 < iVar2; local_34 = local_34 + 1) {
      integrals[local_34] = dVar5 * integrals[local_34];
    }
  }
  return;
}

Assistant:

void TasmanianSparseGrid::integrateHierarchicalFunctions(double integrals[]) const{
    if (empty()) throw std::runtime_error("ERROR: cannot compute the integrals for a basis in an empty grid.");
    base->integrateHierarchicalFunctions(integrals);
    if (domain_transform_a.size() != 0){
        double scale = getQuadratureScale(base->getNumDimensions(), base->getRule());
        for(int i=0; i<getNumPoints(); i++) integrals[i] *= scale;
    }
}